

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O2

void __thiscall
cmTargetPropCommandBase::HandleInterfaceContent
          (cmTargetPropCommandBase *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool param_4)

{
  char *__rhs;
  undefined7 in_register_00000009;
  string totalContent;
  string propName;
  allocator local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((int)CONCAT71(in_register_00000009,prepend) == 0) {
    std::operator+(&local_a0,"INTERFACE_",&this->Property);
    (*(this->super_cmCommand).super_cmObject._vptr_cmObject[0x11])(&local_c0,this,content);
    cmTarget::AppendProperty(tgt,&local_a0,local_c0._M_dataplus._M_p,false);
  }
  else {
    std::__cxx11::string::string((string *)&local_c0,"INTERFACE_",(allocator *)&local_60);
    std::operator+(&local_a0,&local_c0,&this->Property);
    std::__cxx11::string::~string((string *)&local_c0);
    __rhs = cmTarget::GetProperty(tgt,&local_a0);
    (*(this->super_cmCommand).super_cmObject._vptr_cmObject[0x11])(&local_60,this,content);
    if (__rhs == (char *)0x0) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      local_80._M_string_length = 0;
      local_80.field_2._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::string((string *)&local_40,";",&local_c1);
      std::operator+(&local_80,&local_40,__rhs);
    }
    std::operator+(&local_c0,&local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    if (__rhs != (char *)0x0) {
      std::__cxx11::string::~string((string *)&local_40);
    }
    std::__cxx11::string::~string((string *)&local_60);
    cmTarget::SetProperty(tgt,&local_a0,local_c0._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void cmTargetPropCommandBase::HandleInterfaceContent(cmTarget *tgt,
                                  const std::vector<std::string> &content,
                                  bool prepend, bool)
{
  if (prepend)
    {
    const std::string propName = std::string("INTERFACE_") + this->Property;
    const char *propValue = tgt->GetProperty(propName);
    const std::string totalContent = this->Join(content) + (propValue
                                              ? std::string(";") + propValue
                                              : std::string());
    tgt->SetProperty(propName, totalContent.c_str());
    }
  else
    {
    tgt->AppendProperty("INTERFACE_" + this->Property,
                          this->Join(content).c_str());
    }
}